

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

mp_limb_t mpn_neg(mp_ptr rp,mp_srcptr up,mp_size_t n)

{
  long in_RDX;
  long *in_RSI;
  long *in_RDI;
  long local_20;
  long *local_18;
  long *local_10;
  
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  while( true ) {
    if (*local_18 != 0) {
      *local_10 = -*local_18;
      mpn_com((mp_ptr)(local_10 + 1),(mp_srcptr)(local_18 + 1),local_20 + -1);
      return 1;
    }
    *local_10 = 0;
    local_20 = local_20 + -1;
    if (local_20 == 0) break;
    local_18 = local_18 + 1;
    local_10 = local_10 + 1;
  }
  return 0;
}

Assistant:

mp_limb_t
mpn_neg (mp_ptr rp, mp_srcptr up, mp_size_t n)
{
  while (*up == 0)
    {
      *rp = 0;
      if (!--n)
	return 0;
      ++up; ++rp;
    }
  *rp = - *up;
  mpn_com (++rp, ++up, --n);
  return 1;
}